

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O3

uint32 remap(map_t *m,uint32 x)

{
  ulong uVar1;
  uint32 uVar2;
  
  uVar1 = (ulong)x % (ulong)m->n_map;
  if (m->map[uVar1].x == x) {
    return m->map[uVar1].y;
  }
  uVar2 = remap_assign(m,(uint32)uVar1,x);
  return uVar2;
}

Assistant:

uint32
remap(map_t *m, uint32 x)
{
    uint32 hx;

    hx = x % m->n_map;
    
    if (m->map[hx].x == x)
	return m->map[hx].y;
    else {
	return remap_assign(m, hx, x);
    }
}